

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O2

void anon_unknown.dwarf_1c35ae::testMultiPartOutputFileForExpectedFailure
               (vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *headers,string *fn,
               string *failMessage)

{
  char *pcVar1;
  Header *pHVar2;
  pointer pHVar3;
  int iVar4;
  ostream *poVar5;
  MultiPartOutputFile file;
  
  remove((fn->_M_dataplus)._M_p);
  pcVar1 = (fn->_M_dataplus)._M_p;
  pHVar2 = (headers->super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar3 = (headers->super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (&file,pcVar1,pHVar2,(int)(((long)pHVar3 - (long)pHVar2) / 0x38),false,iVar4);
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- ");
  poVar5 = std::operator<<(poVar5,(string *)failMessage);
  std::endl<char,std::char_traits<char>>(poVar5);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x7e,
                "void (anonymous namespace)::testMultiPartOutputFileForExpectedFailure(const vector<Header> &, const std::string &, const string &)"
               );
}

Assistant:

void
testMultiPartOutputFileForExpectedFailure (
    const vector<Header>& headers,
    const std::string&    fn,
    const string&         failMessage = "")
{
    bool caught = false;

    try
    {
        remove (fn.c_str ());
        MultiPartOutputFile file (
            fn.c_str (), headers.data (), headers.size ());
        cerr << "ERROR -- " << failMessage << endl;
        assert (false);
    }
    catch (const IEX_NAMESPACE::ArgExc& e)
    {
        // expected behaviour
        caught = true;
    }
    assert (caught);
}